

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall
helics::FilterFederate::FilterFederate
          (FilterFederate *this,GlobalFederateId fedID,string *name,GlobalBrokerId coreID,
          Core *param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->mFedID).gid = fedID.gid;
  (this->mCoreID).gid = coreID.gid;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar5;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar4;
    (this->mName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FilterFederate.cpp:33:12)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FilterFederate.cpp:33:12)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  TimeCoordinator::TimeCoordinator
            (&this->mCoord,(function<void_(const_helics::ActionMessage_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  this->mHandles = (HandleManager *)0x0;
  this->current_state = CREATED;
  p_Var3 = &(this->filterCoord)._M_t._M_impl.super__Rb_tree_header;
  (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  memset(&(this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x138);
  std::
  _Deque_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ::_M_initialize_map(&(this->timeBlockProcesses).
                       super__Deque_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                      ,0);
  (this->minReturnTime).internalTimeCode = 0x7fffffffffffffff;
  p_Var3 = &(this->ongoingFilterProcesses)._M_t._M_impl.super__Rb_tree_header;
  (this->ongoingFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ongoingFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ongoingFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->ongoingFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->ongoingFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->ongoingDestFilterProcesses)._M_t._M_impl.super__Rb_tree_header;
  (this->ongoingDestFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ongoingDestFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ongoingDestFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->ongoingDestFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->ongoingDestFilterProcesses)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->messageCounter).super___atomic_base<int>._M_i = 0x36;
  this->usingGlobalTime = false;
  (this->filters).dataStorage.
  super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).dataStorage.
  super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).dataStorage.
  super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).lookup._M_h._M_buckets = &(this->filters).lookup._M_h._M_single_bucket;
  (this->filters).lookup._M_h._M_bucket_count = 1;
  (this->filters).lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filters).lookup._M_h._M_element_count = 0;
  (this->filters).lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filters).lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filters).lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mCoord).super_BaseTimeCoordinator.mSourceId.gid = fedID.gid;
  TimeCoordinator::setOptionFlag(&this->mCoord,0x51,true);
  (this->mCoord).super_BaseTimeCoordinator.nonGranting = true;
  return;
}

Assistant:

FilterFederate::FilterFederate(GlobalFederateId fedID,
                               std::string name,
                               GlobalBrokerId coreID,
                               Core* /*core*/):
    mFedID(fedID), mCoreID(coreID), mName(std::move(name)), /*mCore(core),*/
    mCoord([this](const ActionMessage& msg) { routeMessage(msg); })
{
    mCoord.setSourceId(fedID);
    mCoord.setOptionFlag(helics::defs::Flags::EVENT_TRIGGERED, true);
    mCoord.specifyNonGranting(true);
}